

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_fast.c
# Opt level: O3

void lzma_lzma_optimum_fast
               (lzma_lzma1_encoder *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res)

{
  lzma_match *plVar1;
  uint8_t *__s1;
  ulong uVar2;
  uint uVar3;
  lzma_mf *plVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint32_t *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  short *psVar16;
  uint uVar17;
  uint32_t uVar18;
  size_t __n;
  uint uVar19;
  ulong uVar20;
  uint32_t matches_count;
  uint local_54;
  uint32_t *local_50;
  uint32_t *local_48;
  lzma_mf *local_40;
  ulong local_38;
  
  uVar10 = mf->nice_len;
  if (mf->read_ahead == 1) {
    local_54 = coder->matches_count;
    uVar5 = coder->longest_match_length;
  }
  else {
    if (mf->read_ahead != 0) {
      __assert_fail("mf->read_ahead == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_fast.c"
                    ,0x20,
                    "void lzma_lzma_optimum_fast(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict)"
                   );
    }
    uVar5 = lzma_mf_find(mf,&local_54,coder->matches);
  }
  uVar15 = (ulong)uVar5;
  uVar17 = mf->read_pos;
  uVar6 = (mf->write_pos - uVar17) + 1;
  uVar3 = 0x111;
  if (uVar6 < 0x111) {
    uVar3 = uVar6;
  }
  if (uVar6 < 2) {
    *back_res = 0xffffffff;
    *len_res = 1;
    return;
  }
  __s1 = mf->buffer + uVar17;
  psVar16 = (short *)(mf->buffer + ((ulong)uVar17 - 1));
  uVar13 = 0;
  uVar17 = 0;
  uVar9 = 0;
  do {
    local_50 = back_res;
    local_48 = len_res;
    local_40 = mf;
    if (*psVar16 == *(short *)(__s1 + (-2 - (ulong)coder->reps[uVar13]))) {
      uVar19 = uVar3;
      if (uVar6 != 2) {
        uVar20 = 2;
LAB_006a3803:
        uVar14 = *(long *)((long)psVar16 + uVar20) -
                 *(long *)(__s1 + uVar20 + (-2 - (ulong)coder->reps[uVar13]));
        if (uVar14 == 0) goto code_r0x006a380f;
        uVar2 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        uVar19 = (int)uVar20 + ((uint)(uVar2 >> 3) & 0x1fffffff);
        if (uVar3 <= uVar19) {
          uVar19 = uVar3;
        }
      }
LAB_006a382f:
      if (uVar10 <= uVar19) {
        *back_res = (uint32_t)uVar13;
        *len_res = uVar19;
        uVar18 = uVar19 - 1;
        if (uVar18 == 0) {
          return;
        }
        (*mf->skip)(mf,uVar18);
        mf->read_ahead = mf->read_ahead + uVar18;
        return;
      }
      if (uVar17 < uVar19) {
        uVar9 = uVar13 & 0xffffffff;
        uVar17 = uVar19;
      }
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 4);
  if (uVar5 < uVar10) {
    uVar18 = 0;
    if (1 < uVar5) {
      uVar13 = (ulong)local_54;
      uVar18 = coder->matches[local_54 - 1].dist;
      if (1 < uVar13) {
        puVar12 = &coder->matches[uVar13 - 2].dist;
        do {
          plVar1 = (lzma_match *)(puVar12 + -1);
          if (((int)uVar15 != plVar1->len + 1) || (uVar10 = *puVar12, uVar18 >> 7 <= uVar10)) break;
          local_54 = (int)uVar13 - 1;
          uVar13 = (ulong)local_54;
          puVar12 = puVar12 + -2;
          uVar15 = (ulong)plVar1->len;
          uVar18 = uVar10;
        } while (1 < local_54);
      }
      uVar10 = 1;
      if (uVar18 < 0x80) {
        uVar10 = (uint)uVar15;
      }
      if ((uint)uVar15 == 2) {
        uVar15 = (ulong)uVar10;
      }
    }
    uVar10 = (uint)uVar15;
    if ((1 < uVar17) &&
       (((uVar10 <= uVar17 + 1 || ((uVar10 <= uVar17 + 2 && (0x200 < uVar18)))) ||
        ((uVar10 <= uVar17 + 3 && (0x8000 < uVar18)))))) {
      *back_res = (uint32_t)uVar9;
      *len_res = uVar17;
      uVar18 = uVar17 - 1;
      goto LAB_006a3986;
    }
    if ((uVar6 == 2) || (uVar10 < 2)) goto LAB_006a39e4;
    local_38 = uVar15;
    uVar7 = lzma_mf_find(mf,&coder->matches_count,coder->matches);
    coder->longest_match_length = uVar7;
    uVar10 = (uint)local_38;
    if (1 < uVar7) {
      uVar5 = coder->matches[coder->matches_count - 1].dist;
      if ((uVar10 <= uVar7) && (uVar5 < uVar18)) {
LAB_006a39e4:
        *local_50 = 0xffffffff;
        *local_48 = 1;
        return;
      }
      if (((uVar10 + 1 < uVar7) || (uVar7 == uVar10 + 1 && uVar5 >> 7 <= uVar18)) ||
         (((2 < uVar10 && (uVar10 <= uVar7 + 1)) && (uVar5 < uVar18 >> 7)))) goto LAB_006a39e4;
    }
    __n = 2;
    if (2 < uVar10 - 1) {
      __n = (size_t)(uVar10 - 1);
    }
    lVar11 = 0;
    do {
      iVar8 = bcmp(__s1,(void *)((long)psVar16 - (ulong)coder->reps[lVar11]),__n);
      if (iVar8 == 0) goto LAB_006a39e4;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    *local_50 = uVar18 + 4;
    *local_48 = (uint32_t)local_38;
    uVar18 = (uint32_t)local_38 - 2;
  }
  else {
    *back_res = coder->matches[local_54 - 1].dist + 4;
    *len_res = uVar5;
    uVar18 = uVar5 - 1;
  }
  if (uVar18 == 0) {
    return;
  }
LAB_006a3986:
  plVar4 = local_40;
  (*local_40->skip)(local_40,uVar18);
  plVar4->read_ahead = plVar4->read_ahead + uVar18;
  return;
code_r0x006a380f:
  uVar20 = uVar20 + 8;
  if (uVar3 <= uVar20) goto LAB_006a382f;
  goto LAB_006a3803;
}

Assistant:

extern void
lzma_lzma_optimum_fast(lzma_lzma1_encoder *restrict coder,
		lzma_mf *restrict mf,
		uint32_t *restrict back_res, uint32_t *restrict len_res)
{
	const uint32_t nice_len = mf->nice_len;

	uint32_t len_main;
	uint32_t matches_count;
	if (mf->read_ahead == 0) {
		len_main = mf_find(mf, &matches_count, coder->matches);
	} else {
		assert(mf->read_ahead == 1);
		len_main = coder->longest_match_length;
		matches_count = coder->matches_count;
	}

	const uint8_t *buf = mf_ptr(mf) - 1;
	const uint32_t buf_avail = my_min(mf_avail(mf) + 1, MATCH_LEN_MAX);

	if (buf_avail < 2) {
		// There's not enough input left to encode a match.
		*back_res = UINT32_MAX;
		*len_res = 1;
		return;
	}

	// Look for repeated matches; scan the previous four match distances
	uint32_t rep_len = 0;
	uint32_t rep_index = 0;

	for (uint32_t i = 0; i < REPS; ++i) {
		// Pointer to the beginning of the match candidate
		const uint8_t *const buf_back = buf - coder->reps[i] - 1;

		// If the first two bytes (2 == MATCH_LEN_MIN) do not match,
		// this rep is not useful.
		if (not_equal_16(buf, buf_back))
			continue;

		// The first two bytes matched.
		// Calculate the length of the match.
		const uint32_t len = lzma_memcmplen(
				buf, buf_back, 2, buf_avail);

		// If we have found a repeated match that is at least
		// nice_len long, return it immediately.
		if (len >= nice_len) {
			*back_res = i;
			*len_res = len;
			mf_skip(mf, len - 1);
			return;
		}

		if (len > rep_len) {
			rep_index = i;
			rep_len = len;
		}
	}

	// We didn't find a long enough repeated match. Encode it as a normal
	// match if the match length is at least nice_len.
	if (len_main >= nice_len) {
		*back_res = coder->matches[matches_count - 1].dist + REPS;
		*len_res = len_main;
		mf_skip(mf, len_main - 1);
		return;
	}

	uint32_t back_main = 0;
	if (len_main >= 2) {
		back_main = coder->matches[matches_count - 1].dist;

		while (matches_count > 1 && len_main ==
				coder->matches[matches_count - 2].len + 1) {
			if (!change_pair(coder->matches[
						matches_count - 2].dist,
					back_main))
				break;

			--matches_count;
			len_main = coder->matches[matches_count - 1].len;
			back_main = coder->matches[matches_count - 1].dist;
		}

		if (len_main == 2 && back_main >= 0x80)
			len_main = 1;
	}

	if (rep_len >= 2) {
		if (rep_len + 1 >= len_main
				|| (rep_len + 2 >= len_main
					&& back_main > (UINT32_C(1) << 9))
				|| (rep_len + 3 >= len_main
					&& back_main > (UINT32_C(1) << 15))) {
			*back_res = rep_index;
			*len_res = rep_len;
			mf_skip(mf, rep_len - 1);
			return;
		}
	}

	if (len_main < 2 || buf_avail <= 2) {
		*back_res = UINT32_MAX;
		*len_res = 1;
		return;
	}

	// Get the matches for the next byte. If we find a better match,
	// the current byte is encoded as a literal.
	coder->longest_match_length = mf_find(mf,
			&coder->matches_count, coder->matches);

	if (coder->longest_match_length >= 2) {
		const uint32_t new_dist = coder->matches[
				coder->matches_count - 1].dist;

		if ((coder->longest_match_length >= len_main
					&& new_dist < back_main)
				|| (coder->longest_match_length == len_main + 1
					&& !change_pair(back_main, new_dist))
				|| (coder->longest_match_length > len_main + 1)
				|| (coder->longest_match_length + 1 >= len_main
					&& len_main >= 3
					&& change_pair(new_dist, back_main))) {
			*back_res = UINT32_MAX;
			*len_res = 1;
			return;
		}
	}

	// In contrast to LZMA SDK, dictionary could not have been moved
	// between mf_find() calls, thus it is safe to just increment
	// the old buf pointer instead of recalculating it with mf_ptr().
	++buf;

	const uint32_t limit = my_max(2, len_main - 1);

	for (uint32_t i = 0; i < REPS; ++i) {
		if (memcmp(buf, buf - coder->reps[i] - 1, limit) == 0) {
			*back_res = UINT32_MAX;
			*len_res = 1;
			return;
		}
	}

	*back_res = back_main + REPS;
	*len_res = len_main;
	mf_skip(mf, len_main - 2);
	return;
}